

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O2

void push_path(h2o_req_t *src_req,char *abspath,size_t abspath_len)

{
  h2o_headers_t *headers;
  h2o_mem_pool_t *pool;
  byte *pbVar1;
  byte bVar2;
  uint32_t uVar3;
  h2o_http2_conn_t *conn;
  h2o_url_scheme_t *phVar4;
  h2o_hostconf_t *phVar5;
  h2o_header_t *phVar6;
  h2o_token_t *token;
  int iVar7;
  h2o_cache_digests_state_t hVar8;
  h2o_cache_hashcode_t hVar9;
  h2o_cache_hashcode_t hVar10;
  h2o_cache_hashcode_t hVar11;
  ssize_t sVar12;
  h2o_http2_casper_t *phVar13;
  ssize_t cursor;
  h2o_cache_t *phVar14;
  h2o_http2_stream_t *stream;
  size_t sVar15;
  long lVar16;
  h2o_iovec_t hVar17;
  h2o_cache_hashcode_t url_hash;
  undefined8 local_88;
  undefined8 uStack_80;
  h2o_iovec_t local_78;
  char *local_68;
  undefined8 local_60;
  char *local_58;
  size_t sStack_50;
  char *local_48;
  size_t local_40;
  
  if ((((((src_req[-1].res.status & 1) != 0) &&
        ((undefined1  [12])((undefined1  [12])src_req->hostconf->http2 & (undefined1  [12])0x2) !=
         (undefined1  [12])0x0)) &&
       (conn = (h2o_http2_conn_t *)src_req->conn, (conn->peer_settings).enable_push != 0)) &&
      (((conn->num_streams).push.open < (conn->peer_settings).max_concurrent_streams &&
       ((conn->push_stream_ids).max_open < 0x7ffffff0)))) &&
     (((conn->_pending_reqs).next == &conn->_pending_reqs &&
      (iVar7 = can_run_requests(conn), iVar7 != 0)))) {
    headers = &src_req->headers;
    cursor = -1;
    sVar12 = h2o_find_header(headers,h2o__tokens + 0x3b,-1);
    if (sVar12 == -1) {
      if (src_req[-1].error_logs.size != 0) {
        phVar4 = (src_req->input).scheme;
        local_78.base = (phVar4->name).base;
        local_78.len = (phVar4->name).len;
        local_68 = "://";
        local_60 = 3;
        local_58 = (src_req->input).authority.base;
        sStack_50 = (src_req->input).authority.len;
        local_48 = abspath;
        local_40 = abspath_len;
        hVar17 = h2o_concat_list(&src_req->pool,&local_78,4);
        hVar8 = h2o_cache_digests_lookup_by_url
                          ((h2o_cache_digests_t *)src_req[-1].error_logs.size,hVar17.base,hVar17.len
                          );
        if (hVar8 == H2O_CACHE_DIGESTS_STATE_FRESH) {
          return;
        }
      }
      phVar5 = src_req->hostconf;
      if (((phVar5->http2).casper.capacity_bits != 0) &&
         (bVar2 = (byte)src_req[-1].error_logs.capacity, (bVar2 & 1) == 0)) {
        *(byte *)&src_req[-1].error_logs.capacity = bVar2 | 1;
        if (conn->casper == (h2o_http2_casper_t *)0x0) {
          phVar13 = h2o_http2_casper_create((phVar5->http2).casper.capacity_bits,6);
          conn->casper = phVar13;
        }
        while (cursor = h2o_find_header(headers,h2o__tokens + 0x18,cursor), cursor != -1) {
          h2o_http2_casper_consume_cookie
                    (conn->casper,headers->entries[cursor].value.base,
                     headers->entries[cursor].value.len);
        }
      }
      if (conn->push_memo == (h2o_cache_t *)0x0) {
        phVar14 = h2o_cache_create(0,0x400,1,(_func_void_h2o_iovec_t *)0x0);
        conn->push_memo = phVar14;
      }
      phVar4 = (src_req->input).scheme;
      hVar9 = h2o_cache_calchash((phVar4->name).base,(phVar4->name).len);
      hVar10 = h2o_cache_calchash((src_req->input).authority.base,(src_req->input).authority.len);
      hVar11 = h2o_cache_calchash(abspath,abspath_len);
      url_hash = hVar10 ^ hVar11 ^ hVar9;
      local_88 = 0;
      uStack_80 = 0;
      hVar17.len = 4;
      hVar17.base = (char *)&url_hash;
      iVar7 = h2o_cache_set(conn->push_memo,0,hVar17,url_hash,(h2o_iovec_t)ZEXT816(0));
      if (iVar7 == 0) {
        stream = h2o_http2_stream_open
                           (conn,(conn->push_stream_ids).max_open + 2,(h2o_req_t *)0x0,
                            &h2o_http2_default_priority);
        uVar3 = src_req[-1].res.status;
        (stream->received_priority).dependency = uVar3;
        (stream->field_12).push.parent_stream_id = uVar3;
        h2o_http2_scheduler_open
                  (&(stream->_refs).scheduler,(h2o_http2_scheduler_node_t *)&src_req[-1].upgrade.len
                   ,0x10,0);
        h2o_http2_stream_prepare_for_request(conn,stream);
        (stream->req).input.method.base = "GET";
        (stream->req).input.method.len = 3;
        (stream->req).input.scheme = (src_req->input).scheme;
        pool = &(stream->req).pool;
        hVar17 = h2o_strdup(pool,(src_req->input).authority.base,(src_req->input).authority.len);
        (stream->req).input.authority = hVar17;
        hVar17 = h2o_strdup(pool,abspath,abspath_len);
        (stream->req).input.path = hVar17;
        (stream->req).version = 0x200;
        lVar16 = 0x18;
        for (sVar15 = 0; sVar15 != (src_req->headers).size; sVar15 = sVar15 + 1) {
          phVar6 = headers->entries;
          iVar7 = h2o_iovec_is_token(*(h2o_iovec_t **)((long)phVar6 + lVar16 + -0x18));
          if ((iVar7 != 0) &&
             (token = *(h2o_token_t **)((long)phVar6 + lVar16 + -0x18),
             (token->field_0x11 & 0x10) != 0)) {
            hVar17 = h2o_strdup(pool,*(char **)((long)phVar6 + lVar16 + -8),
                                *(size_t *)((long)&phVar6->name + lVar16));
            h2o_add_header(pool,&(stream->req).headers,token,(char *)0x0,hVar17.base,
                           *(size_t *)((long)&phVar6->name + lVar16));
          }
          lVar16 = lVar16 + 0x20;
        }
        execute_or_enqueue_request(conn,stream);
        if ((((ulong)stream->field_12 & 0x100000000) == 0) &&
           (stream->state != H2O_HTTP2_STREAM_STATE_END_STREAM)) {
          h2o_hpack_flatten_request
                    (&(conn->_write).buf,&conn->_output_header_table,stream->stream_id,
                     (ulong)(conn->peer_settings).max_frame_size,&stream->req,
                     (stream->field_12).push.parent_stream_id);
          pbVar1 = (byte *)((long)&stream->field_12 + 4);
          *pbVar1 = *pbVar1 | 1;
        }
      }
    }
  }
  return;
}

Assistant:

static void push_path(h2o_req_t *src_req, const char *abspath, size_t abspath_len)
{
    h2o_http2_conn_t *conn = (void *)src_req->conn;
    h2o_http2_stream_t *src_stream = H2O_STRUCT_FROM_MEMBER(h2o_http2_stream_t, req, src_req);

    /* RFC 7540 8.2.1: PUSH_PROMISE frames can be sent by the server in response to any client-initiated stream */
    if (h2o_http2_stream_is_push(src_stream->stream_id))
        return;

    if (!src_stream->req.hostconf->http2.push_preload || !conn->peer_settings.enable_push ||
        conn->num_streams.push.open >= conn->peer_settings.max_concurrent_streams)
        return;

    if (conn->push_stream_ids.max_open >= 0x7ffffff0)
        return;
    if (!(h2o_linklist_is_empty(&conn->_pending_reqs) && can_run_requests(conn)))
        return;

    if (h2o_find_header(&src_stream->req.headers, H2O_TOKEN_X_FORWARDED_FOR, -1) != -1)
        return;

    if (src_stream->cache_digests != NULL) {
        h2o_iovec_t url = h2o_concat(&src_stream->req.pool, src_stream->req.input.scheme->name, h2o_iovec_init(H2O_STRLIT("://")),
                                     src_stream->req.input.authority, h2o_iovec_init(abspath, abspath_len));
        if (h2o_cache_digests_lookup_by_url(src_stream->cache_digests, url.base, url.len) == H2O_CACHE_DIGESTS_STATE_FRESH)
            return;
    }

    /* delayed initialization of casper (cookie-based), that MAY be used together to cache-digests */
    if (src_stream->req.hostconf->http2.casper.capacity_bits != 0) {
        if (!src_stream->pull.casper_is_ready) {
            src_stream->pull.casper_is_ready = 1;
            if (conn->casper == NULL)
                h2o_http2_conn_init_casper(conn, src_stream->req.hostconf->http2.casper.capacity_bits);
            ssize_t header_index;
            for (header_index = -1;
                 (header_index = h2o_find_header(&src_stream->req.headers, H2O_TOKEN_COOKIE, header_index)) != -1;) {
                h2o_header_t *header = src_stream->req.headers.entries + header_index;
                h2o_http2_casper_consume_cookie(conn->casper, header->value.base, header->value.len);
            }
        }
    }

    /* update the push memo, and if it already pushed on the same connection, return */
    if (update_push_memo(conn, &src_stream->req, abspath, abspath_len))
        return;

    /* open the stream */
    h2o_http2_stream_t *stream = h2o_http2_stream_open(conn, conn->push_stream_ids.max_open + 2, NULL, &h2o_http2_default_priority);
    stream->received_priority.dependency = src_stream->stream_id;
    stream->push.parent_stream_id = src_stream->stream_id;
    h2o_http2_scheduler_open(&stream->_refs.scheduler, &src_stream->_refs.scheduler.node, 16, 0);
    h2o_http2_stream_prepare_for_request(conn, stream);

    /* setup request */
    stream->req.input.method = (h2o_iovec_t){H2O_STRLIT("GET")};
    stream->req.input.scheme = src_stream->req.input.scheme;
    stream->req.input.authority =
        h2o_strdup(&stream->req.pool, src_stream->req.input.authority.base, src_stream->req.input.authority.len);
    stream->req.input.path = h2o_strdup(&stream->req.pool, abspath, abspath_len);
    stream->req.version = 0x200;

    { /* copy headers that may affect the response (of a cacheable response) */
        size_t i;
        for (i = 0; i != src_stream->req.headers.size; ++i) {
            h2o_header_t *src_header = src_stream->req.headers.entries + i;
            if (h2o_iovec_is_token(src_header->name)) {
                h2o_token_t *token = H2O_STRUCT_FROM_MEMBER(h2o_token_t, buf, src_header->name);
                if (token->copy_for_push_request) {
                    h2o_add_header(&stream->req.pool, &stream->req.headers, token, NULL,
                                   h2o_strdup(&stream->req.pool, src_header->value.base, src_header->value.len).base,
                                   src_header->value.len);
                }
            }
        }
    }

    execute_or_enqueue_request(conn, stream);

    /* send push-promise ASAP (before the parent stream gets closed), even if execute_or_enqueue_request did not trigger the
     * invocation of send_headers */
    if (!stream->push.promise_sent && stream->state != H2O_HTTP2_STREAM_STATE_END_STREAM)
        h2o_http2_stream_send_push_promise(conn, stream);
}